

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::Maybe<kj::OwnFd>_> __thiscall
kj::AsyncCapabilityStream::tryReceiveFd(AsyncCapabilityStream *this)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseArena *pPVar3;
  void *pvVar4;
  long *in_RSI;
  ResultHolder *ptrCopy;
  TransformPromiseNodeBase *this_00;
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  OwnPromiseNode local_30;
  
  pPVar3 = (PromiseArena *)operator_new(8);
  pPVar3->bytes[0] = '\0';
  pPVar3->bytes[1] = '\0';
  pPVar3->bytes[2] = '\0';
  pPVar3->bytes[3] = '\0';
  pPVar3->bytes[4] = '\0';
  pPVar3->bytes[5] = '\0';
  pPVar3->bytes[6] = '\0';
  pPVar3->bytes[7] = '\0';
  pPVar3->bytes[4] = 0xff;
  pPVar3->bytes[5] = 0xff;
  pPVar3->bytes[6] = 0xff;
  pPVar3->bytes[7] = 0xff;
  (**(code **)(*in_RSI + 0x78))(&local_30);
  OVar2.ptr = local_30.ptr;
  pPVar1 = ((local_30.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_30.ptr - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_30,
               kj::_::
               SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2646:23)>
               ::anon_class_16_1_6971b95b_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_00648c90;
    *(undefined8 **)((long)pvVar4 + 0x3f0) =
         &kj::_::HeapDisposer<kj::AsyncCapabilityStream::tryReceiveFd()::ResultHolder>::instance;
    *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPVar3;
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((local_30.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(local_30.ptr + -3);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_30,
               kj::_::
               SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2646:23)>
               ::anon_class_16_1_6971b95b_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_00648c90;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)
         &kj::_::HeapDisposer<kj::AsyncCapabilityStream::tryReceiveFd()::ResultHolder>::instance;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = pPVar3;
    OVar2.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  OVar2.ptr = local_30.ptr;
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)this_00;
  if (&(local_30.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_30.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<OwnFd>> AsyncCapabilityStream::tryReceiveFd() {
  struct ResultHolder {
    byte b;
    OwnFd fd;
  };
  auto result = kj::heap<ResultHolder>();
  auto promise = tryReadWithFds(&result->b, 1, 1, &result->fd, 1);
  return promise.then([result = kj::mv(result)](ReadResult actual) mutable
                      -> Maybe<OwnFd> {
    if (actual.byteCount == 0) {
      return kj::none;
    }

    KJ_REQUIRE(actual.capCount == 1,
        "expected to receive a file descriptor (e.g. via SCM_RIGHTS), but didn't") {
      return kj::none;
    }

    return kj::mv(result->fd);
  });
}